

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::DynamicMapField::DynamicMapField
          (DynamicMapField *this,Message *default_entry,Arena *arena)

{
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase._vptr_MapFieldBase = (_func_int **)&PTR__MapFieldBase_0066d958;
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase.arena_ = arena;
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase.repeated_field_ = (RepeatedPtrField<google::protobuf::Message> *)0x0;
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase.mutex_.mu_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.mutex_.mu_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.mutex_.mu_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase.mutex_.mu_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  *(__pthread_internal_list **)
   ((long)&(this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.mutex_.mu_.super___mutex_base._M_mutex.__data.__list + 8) =
       (__pthread_internal_list *)0x0;
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase.state_._M_i = STATE_MODIFIED_MAP;
  Arena::OwnDestructor<google::protobuf::internal::WrappedMutex>
            (arena,&(this->
                    super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                    ).super_MapFieldBase.mutex_);
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase._vptr_MapFieldBase = (_func_int **)&PTR__DynamicMapField_0066da00;
  (this->map_).arena_ = arena;
  (this->map_).default_enum_value_ = 0;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::Init(&this->map_);
  this->default_entry_ = default_entry;
  return;
}

Assistant:

DynamicMapField::DynamicMapField(const Message* default_entry, Arena* arena)
    : TypeDefinedMapFieldBase<MapKey, MapValueRef>(arena),
      map_(arena),
      default_entry_(default_entry) {}